

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

int arangodb::velocypack::fpconv_dtoa(double d,char *dest)

{
  uint64_t uVar1;
  char *in_RDI;
  bool bVar2;
  double in_XMM0_Qa;
  int ndigits;
  int K;
  int spec;
  bool neg;
  int str_len;
  char digits [18];
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 local_3c;
  undefined1 in_stack_ffffffffffffffd3;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  uVar1 = get_dbits(in_XMM0_Qa);
  bVar2 = (uVar1 & 0x8000000000000000) != 0;
  if (bVar2) {
    *in_RDI = '-';
  }
  local_3c = (uint)bVar2;
  local_4 = filter_special((double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (local_4 == 0) {
    grisu2(stack0x00000030,(char *)digits._8_8_,(int *)digits._0_8_);
    local_4 = emit_digits(in_RDI,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd4,(bool)in_stack_ffffffffffffffd3);
  }
  local_4 = local_3c + local_4;
  return local_4;
}

Assistant:

int arangodb::velocypack::fpconv_dtoa(double d, char dest[24]) {
  char digits[18];

  int str_len = 0;
  bool neg = false;

  if (get_dbits(d) & signmask) {
    dest[0] = '-';
    str_len++;
    neg = true;
  }

  int spec = filter_special(d, dest + str_len);

  if (spec) {
    return str_len + spec;
  }

  // initialize digits[0] to satisfy scan_build
  digits[0] = '\0';

  int K = 0;
  int ndigits = grisu2(d, digits, &K);

  str_len += emit_digits(digits, ndigits, dest + str_len, K, neg);

  return str_len;
}